

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O3

void luaF_newtbcupval(lua_State *L,StkId level)

{
  long lVar1;
  TValue *pTVar2;
  char *pcVar3;
  char *pcVar4;
  
  if (((level->val).tt_ & 0xf) != 0 && (level->val).tt_ != 1) {
    pTVar2 = luaT_gettmbyobj(L,&level->val,TM_CLOSE);
    if ((pTVar2->tt_ & 0xf) == 0) {
      pcVar3 = luaG_findlocal(L,L->ci,(int)((ulong)((long)level - (L->ci->func).offset) >> 4),
                              (StkId *)0x0);
      pcVar4 = "?";
      if (pcVar3 != (char *)0x0) {
        pcVar4 = pcVar3;
      }
      luaG_runerror(L,"variable \'%s\' got a non-closable value",pcVar4);
    }
    while( true ) {
      lVar1 = (L->tbclist).offset;
      if (((long)level - lVar1 & 0xffff00000U) == 0) break;
      (L->tbclist).p = (StkId)(lVar1 + 0xffff0);
      *(undefined2 *)(lVar1 + 0xffffa) = 0;
    }
    (level->tbclist).delta = (unsigned_short)((ulong)((long)level - lVar1) >> 4);
    (L->tbclist).p = level;
  }
  return;
}

Assistant:

void luaF_newtbcupval (lua_State *L, StkId level) {
  lua_assert(level > L->tbclist.p);
  if (l_isfalse(s2v(level)))
    return;  /* false doesn't need to be closed */
  checkclosemth(L, level);  /* value must have a close method */
  while (cast_uint(level - L->tbclist.p) > MAXDELTA) {
    L->tbclist.p += MAXDELTA;  /* create a dummy node at maximum delta */
    L->tbclist.p->tbclist.delta = 0;
  }
  level->tbclist.delta = cast(unsigned short, level - L->tbclist.p);
  L->tbclist.p = level;
}